

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
::
ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::ConHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
           *this,int info)

{
  int num_items;
  int iVar1;
  int iVar2;
  IntSuffixHandler suffix_handler;
  DblSuffixHandler suffix_handler_1;
  IntSuffixHandler local_22;
  DblSuffixHandler local_21;
  
  iVar2 = *(int *)(*(long *)(this + 8) + 4);
  iVar1 = *(int *)(*(long *)(this + 8) + 0x14);
  num_items = iVar1 + iVar2;
  iVar2 = NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          ::ReadUInt((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                      *)this,1,iVar1 + iVar2 + 1);
  TextReader<fmt::Locale>::ReadName(*(TextReader<fmt::Locale> **)this);
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  if ((info & 4U) == 0) {
    ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::IntReader,mp::NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>::IntSuffixHandler>
              (this,iVar2,num_items,&local_22);
  }
  else {
    ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::DoubleReader,mp::NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>::DblSuffixHandler>
              (this,iVar2,num_items,&local_21);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadSuffix(int info) {
  int num_items = ItemInfo(*this).num_items();
  int num_values = ReadUInt(1, num_items + 1);
  fmt::StringRef name = reader_.ReadName();
  reader_.ReadTillEndOfLine();
  suf::Kind kind = static_cast<suf::Kind>(info & internal::SUFFIX_KIND_MASK);
  if ((info & suf::FLOAT) != 0) {
    typename Handler::DblSuffixHandler
        suffix_handler = handler_.OnDblSuffix(name, kind, num_values);
    ReadSuffixValues<DoubleReader>(num_values, num_items, suffix_handler);
  } else {
    typename Handler::IntSuffixHandler
        suffix_handler = handler_.OnIntSuffix(name, kind, num_values);
    ReadSuffixValues<IntReader>(num_values, num_items, suffix_handler);
  }
}